

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# announce_entry.hpp
# Opt level: O0

void __thiscall
libtorrent::v1_2::announce_endpoint::announce_endpoint
          (announce_endpoint *this,announce_endpoint *param_1)

{
  time_point32 tVar1;
  bool bVar2;
  undefined3 uVar3;
  int iVar4;
  announce_endpoint *param_1_local;
  announce_endpoint *this_local;
  
  boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
            (&this->local_endpoint,&param_1->local_endpoint);
  libtorrent::aux::
  container_wrapper<libtorrent::v1_2::announce_infohash,_libtorrent::protocol_version,_std::array<libtorrent::v1_2::announce_infohash,_2UL>_>
  ::container_wrapper(&this->info_hashes,&param_1->info_hashes);
  tVar1.__d.__r = (param_1->min_announce).__d;
  this->next_announce = (duration)(param_1->next_announce).__d;
  this->min_announce = (time_point32)tVar1.__d.__r;
  ::std::__cxx11::string::string((string *)&this->message,(string *)&param_1->message);
  bVar2 = (param_1->last_error).failed_;
  uVar3 = *(undefined3 *)&(param_1->last_error).field_0x5;
  (this->last_error).val_ = (param_1->last_error).val_;
  (this->last_error).failed_ = bVar2;
  *(undefined3 *)&(this->last_error).field_0x5 = uVar3;
  (this->last_error).cat_ = (param_1->last_error).cat_;
  iVar4 = param_1->scrape_complete;
  this->scrape_incomplete = param_1->scrape_incomplete;
  this->scrape_complete = iVar4;
  this->scrape_downloaded = param_1->scrape_downloaded;
  *(undefined2 *)&this->field_0xf4 = *(undefined2 *)&param_1->field_0xf4;
  this->enabled = param_1->enabled;
  return;
}

Assistant:

struct TORRENT_EXPORT announce_endpoint
	{
#if TORRENT_ABI_VERSION <= 2
#include "libtorrent/aux_/disable_warnings_pop.hpp"
#endif

		announce_endpoint();

		// the local endpoint of the listen interface associated with this endpoint
		tcp::endpoint local_endpoint;

		// torrents can be announced using multiple info hashes
		// for different protocol versions

		// info_hashes[0] is the v1 info hash (SHA1)
		// info_hashes[1] is the v2 info hash (truncated SHA-256)
		aux::array<announce_infohash, num_protocols, protocol_version> info_hashes;

#if TORRENT_ABI_VERSION <= 2
		// reset announce counters and clears the started sent flag.
		// The announce_endpoint will look like we've never talked to
		// the tracker.
		TORRENT_DEPRECATED void reset();

		// deprecated in 2.0, use announce_infohash::can_announce
		// returns true if we can announce to this tracker now.
		// The current time is passed in as ``now``. The ``is_seed``
		// argument is necessary because once we become a seed, we
		// need to announce right away, even if the re-announce timer
		// hasn't expired yet.
		TORRENT_DEPRECATED bool can_announce(time_point now, bool is_seed, std::uint8_t fail_limit) const;

		// deprecated in 2.0, use announce_infohash::is_working
		// returns true if the last time we tried to announce to this
		// tracker succeeded, or if we haven't tried yet.
		TORRENT_DEPRECATED bool is_working() const;

		// for backwards compatibility
		TORRENT_DEPRECATED time_point32 next_announce = (time_point32::min)();
		TORRENT_DEPRECATED time_point32 min_announce = (time_point32::min)();
		TORRENT_DEPRECATED std::string message;
		TORRENT_DEPRECATED error_code last_error;
		TORRENT_DEPRECATED int scrape_incomplete = -1;
		TORRENT_DEPRECATED int scrape_complete = -1;
		TORRENT_DEPRECATED int scrape_downloaded = -1;
		TORRENT_DEPRECATED std::uint8_t fails : 7;
		TORRENT_DEPRECATED bool updating : 1;
		TORRENT_DEPRECATED bool start_sent : 1;
		TORRENT_DEPRECATED bool complete_sent : 1;
#endif

		// set to false to not announce from this endpoint
		bool enabled = true;
	}